

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcreat.c
# Opt level: O3

MATRIX mat_creat(int row,int col,int type)

{
  MATRIX A;
  
  A = _mat_creat(row,col);
  if (A != (MATRIX)0x0) {
    mat_fill(A,type);
  }
  return A;
}

Assistant:

MATRIX	_mat_creat( int row, int col )
{
	MATBODY	*mat;
	int 	i;

	if ((mat = (MATBODY *)malloc( sizeof(MATHEAD) + sizeof(double *) * row)) == NULL)
		return (mat_error( MAT_MALLOC ));

	for (i=0; i<row; i++)
	{
	if ((*((double **)(&mat->matrix) + i) = (double *)malloc(sizeof(double) * col)) == NULL)
		return (mat_error( MAT_MALLOC ));
	}

	mat->head.row = row;
	mat->head.col = col;

	return (&(mat->matrix));
}